

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

int cmCTest::GetTestModelFromString(string *str)

{
  string_view sVar1;
  bool bVar2;
  ulong uVar3;
  undefined1 local_38 [8];
  string rstr;
  string *str_local;
  
  rstr.field_2._8_8_ = str;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    cmsys::SystemTools::LowerCase((string *)local_38,(string *)rstr.field_2._8_8_);
    sVar1 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
    bVar2 = cmHasLiteralPrefix<5ul>(sVar1,(char (*) [5])"cont");
    if (bVar2) {
      str_local._4_4_ = 2;
    }
    else {
      sVar1 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
      bVar2 = cmHasLiteralPrefix<5ul>(sVar1,(char (*) [5])"nigh");
      if (bVar2) {
        str_local._4_4_ = 1;
      }
      else {
        str_local._4_4_ = 0;
      }
    }
    std::__cxx11::string::~string((string *)local_38);
  }
  else {
    str_local._4_4_ = 0;
  }
  return str_local._4_4_;
}

Assistant:

int cmCTest::GetTestModelFromString(const std::string& str)
{
  if (str.empty()) {
    return cmCTest::EXPERIMENTAL;
  }
  std::string rstr = cmSystemTools::LowerCase(str);
  if (cmHasLiteralPrefix(rstr, "cont")) {
    return cmCTest::CONTINUOUS;
  }
  if (cmHasLiteralPrefix(rstr, "nigh")) {
    return cmCTest::NIGHTLY;
  }
  return cmCTest::EXPERIMENTAL;
}